

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O1

void emitter_json_array_kv_begin(emitter_t *emitter,char *json_key)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  
  if (emitter->output < emitter_output_table) {
    if (emitter->emitted_key == true) {
      emitter->emitted_key = false;
    }
    else {
      if (emitter->item_at_depth == true) {
        emitter_printf(emitter,",");
      }
      if (emitter->output != emitter_output_json_compact) {
        emitter_printf(emitter,anon_var_dwarf_6435278 + 8);
        pcVar2 = anon_var_dwarf_6435659 + 7;
        if (emitter->output != emitter_output_json) {
          pcVar2 = " ";
        }
        if (0 < emitter->nesting_depth) {
          iVar1 = emitter->nesting_depth << (emitter->output != emitter_output_json);
          iVar3 = 1;
          if (1 < iVar1) {
            iVar3 = iVar1;
          }
          do {
            emitter_printf(emitter,"%s",pcVar2);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
      }
    }
    pcVar2 = " ";
    if (emitter->output == emitter_output_json_compact) {
      pcVar2 = anon_var_dwarf_643533f + 9;
    }
    emitter_printf(emitter,"\"%s\":%s",json_key,pcVar2);
    emitter->emitted_key = true;
  }
  if (emitter->output < emitter_output_table) {
    if (emitter->emitted_key == true) {
      emitter->emitted_key = false;
    }
    else {
      if (emitter->item_at_depth == true) {
        emitter_printf(emitter,",");
      }
      if (emitter->output != emitter_output_json_compact) {
        emitter_printf(emitter,anon_var_dwarf_6435278 + 8);
        pcVar2 = anon_var_dwarf_6435659 + 7;
        if (emitter->output != emitter_output_json) {
          pcVar2 = " ";
        }
        if (0 < emitter->nesting_depth) {
          iVar1 = emitter->nesting_depth << (emitter->output != emitter_output_json);
          iVar3 = 1;
          if (1 < iVar1) {
            iVar3 = iVar1;
          }
          do {
            emitter_printf(emitter,"%s",pcVar2);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
      }
    }
    emitter_printf(emitter,"[");
    emitter->nesting_depth = emitter->nesting_depth + 1;
    emitter->item_at_depth = false;
  }
  return;
}

Assistant:

static inline void
emitter_json_array_kv_begin(emitter_t *emitter, const char *json_key) {
	emitter_json_key(emitter, json_key);
	emitter_json_array_begin(emitter);
}